

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O3

vrna_exp_param_t * vrna_exp_params(vrna_md_t *md)

{
  vrna_exp_param_t *pvVar1;
  vrna_md_t md_1;
  vrna_md_t local_7f0;
  
  if (md != (vrna_md_t *)0x0) {
    pvVar1 = get_scaled_exp_params(md,-1.0);
    return pvVar1;
  }
  vrna_md_set_default(&local_7f0);
  pvVar1 = get_scaled_exp_params(&local_7f0,-1.0);
  return pvVar1;
}

Assistant:

PUBLIC vrna_exp_param_t *
vrna_exp_params(vrna_md_t *md)
{
  if (md) {
    return get_scaled_exp_params(md, -1.);
  } else {
    vrna_md_t md;
    vrna_md_set_default(&md);
    return get_scaled_exp_params(&md, -1.);
  }
}